

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetris.cpp
# Opt level: O3

void decide(int *blockForEnemy,int *finalX,int *finalY,int *finalO)

{
  int tmp;
  function<double_(Board,_const_Block_&,_double_&,_bool)> local_50;
  
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = evaluate2_sweet;
  local_50._M_invoker =
       std::
       _Function_handler<double_(Board,_const_Block_&,_double_&,_bool),_double_(*)(Board,_const_Block_&,_double_&,_bool)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<double_(Board,_const_Block_&,_double_&,_bool),_double_(*)(Board,_const_Block_&,_double_&,_bool)>
       ::_M_manager;
  set_Eval(&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  precalc(&gameBoard,&myele,&enemyele,&enemyht);
  Place_Turn(1,&gameBoard,gameBoard.currBotColor,gameBoard.currBlockType,finalX,finalY,finalO,&tmp);
  Place_Turn(1,&gameBoard,gameBoard.currBotColor ^ 1,gameBoard.enemyType,&tmp,&tmp,&tmp,
             blockForEnemy);
  return;
}

Assistant:

void decide(int &blockForEnemy, int &finalX, int &finalY, int &finalO)
{
    set_Eval(evaluate2_sweet);
    int tmp;
    precalc(gameBoard, myele, enemyele, enemyht);
    //printf("%d %d %d\n", myele, enemyele, enemyht);

    Place_Turn(1, gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, finalX, finalY, finalO, tmp);
    //while(1);
    Place_Turn(1, gameBoard, gameBoard.currBotColor ^ 1, gameBoard.enemyType, tmp, tmp, tmp, blockForEnemy);
    //naive_place(gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, evaluate3, finalX, finalY, finalO);
    //naive_jam(gameBoard, evaluate3, blockForEnemy);
}